

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O2

void __thiscall trackerboy::apu::Mixer::setBuffer(Mixer *this,size_t samples)

{
  size_t sVar1;
  __uniq_ptr_impl<float,_std::default_delete<float[]>_> __p;
  __uniq_ptr_impl<float,_std::default_delete<float[]>_> local_20;
  
  sVar1 = samples * 2 + 0x20;
  if (sVar1 != this->mBuffersize) {
    std::make_unique<float[]>((size_t)&local_20);
    __p._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl =
         local_20._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl;
    local_20._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl =
         (tuple<float_*,_std::default_delete<float[]>_>)
         (_Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>)0x0;
    std::__uniq_ptr_impl<float,_std::default_delete<float[]>_>::reset
              ((__uniq_ptr_impl<float,_std::default_delete<float[]>_> *)&this->mBuffer,
               (pointer)__p._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                        super__Head_base<0UL,_float_*,_false>._M_head_impl);
    std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
              ((unique_ptr<float[],_std::default_delete<float[]>_> *)&local_20);
    this->mBuffersize = sVar1;
  }
  clear(this);
  return;
}

Assistant:

void Mixer::setBuffer(size_t samples) {
    auto size = (samples + TU::STEP_WIDTH) * 2;
    if (size != mBuffersize) {
        mBuffer = std::make_unique<float[]>(size);
        mBuffersize = size;
    }
    clear();
}